

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

int64_t tar_atol(char *p,size_t char_cnt)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  size_t sVar11;
  
  bVar1 = *p;
  if (-1 < (char)bVar1) {
    iVar5 = tar_atol_base_n(p,char_cnt,L'\b');
    return iVar5;
  }
  bVar4 = bVar1 >> 6 & 1;
  bVar2 = bVar1 & 0x3f;
  if (bVar4 != 0) {
    bVar2 = bVar1;
  }
  uVar7 = (ulong)bVar2;
  uVar9 = 0xff;
  if (bVar4 == 0) {
    uVar9 = 0;
  }
  if (8 < char_cnt) {
    pbVar10 = (byte *)(p + 1);
    sVar11 = char_cnt;
    do {
      if (uVar9 != (uint)uVar7) goto LAB_0021095b;
      sVar11 = sVar11 - 1;
      uVar7 = (ulong)*pbVar10;
      pbVar10 = pbVar10 + 1;
    } while (8 < sVar11);
  }
  if ((uVar9 ^ (uint)uVar7) < 0x80) {
    uVar6 = -(ulong)bVar4;
    sVar11 = 8;
    if (8 < char_cnt) {
      sVar11 = char_cnt;
    }
    lVar8 = -7;
    do {
      uVar6 = uVar7 | uVar6 << 8;
      lVar3 = lVar8 + sVar11;
      uVar7 = (ulong)(byte)p[lVar3];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    return uVar6 << 8 | (ulong)(byte)p[lVar3];
  }
LAB_0021095b:
  iVar5 = -0x8000000000000000;
  if ((bVar1 & 0x40) == 0) {
    iVar5 = 0x7fffffffffffffff;
  }
  return iVar5;
}

Assistant:

static int64_t
tar_atol(const char *p, size_t char_cnt)
{
	/*
	 * Technically, GNU tar considers a field to be in base-256
	 * only if the first byte is 0xff or 0x80.
	 */
	if (*p & 0x80)
		return (tar_atol256(p, char_cnt));
	return (tar_atol8(p, char_cnt));
}